

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary
          (InvocationInterlockPlacementPass *this,BasicBlock *block,Op opcode,bool at_end)

{
  Op OVar1;
  Instruction *pIVar2;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  _Var3;
  IRContext *pIVar4;
  iterator_template<spvtools::opt::Instruction> *this_00;
  undefined1 local_50 [16];
  Instruction *end_inst;
  undefined1 local_38 [16];
  Instruction *begin_inst;
  undefined1 local_1d;
  Op local_1c;
  bool at_end_local;
  IRContext *pIStack_18;
  Op opcode_local;
  BasicBlock *block_local;
  InvocationInterlockPlacementPass *this_local;
  
  local_1d = at_end;
  local_1c = opcode;
  pIStack_18 = (IRContext *)block;
  block_local = (BasicBlock *)this;
  if (at_end) {
    BasicBlock::begin((BasicBlock *)&begin_inst);
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)&begin_inst);
    OVar1 = opt::Instruction::opcode(pIVar2);
    if (OVar1 == OpPhi) {
      __assert_fail("block->begin()->opcode() != spv::Op::OpPhi && \"addInstructionAtBlockBoundary expects to be called with at_end == \" \"true only if there is a single successor to block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                    ,0x53,
                    "void spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(BasicBlock *, spv::Op, bool)"
                   );
    }
    _Var3.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          )::operator_new(0x70);
    pIVar4 = Pass::context(&this->super_Pass);
    opt::Instruction::Instruction
              ((Instruction *)
               _Var3.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar4,
               local_1c);
    local_38._8_8_ =
         _Var3.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    BasicBlock::tail((BasicBlock *)local_38);
    this_00 = &InstructionList::iterator::operator--((iterator *)local_38)->super_iterator;
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(this_00);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertAfter
              ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
               _Var3.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar2);
  }
  else {
    BasicBlock::begin((BasicBlock *)&end_inst);
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)&end_inst);
    OVar1 = opt::Instruction::opcode(pIVar2);
    if (OVar1 == OpPhi) {
      __assert_fail("block->begin()->opcode() != spv::Op::OpPhi && \"addInstructionAtBlockBoundary expects to be called with at_end == \" \"false only if there is a single predecessor to block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                    ,0x5a,
                    "void spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(BasicBlock *, spv::Op, bool)"
                   );
    }
    _Var3.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          )::operator_new(0x70);
    pIVar4 = Pass::context(&this->super_Pass);
    opt::Instruction::Instruction
              ((Instruction *)
               _Var3.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar4,
               local_1c);
    local_50._8_8_ =
         _Var3.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    BasicBlock::begin((BasicBlock *)local_50);
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_50);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
               _Var3.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar2);
  }
  return;
}

Assistant:

void InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(
    BasicBlock* block, spv::Op opcode, bool at_end) {
  if (at_end) {
    assert(block->begin()->opcode() != spv::Op::OpPhi &&
           "addInstructionAtBlockBoundary expects to be called with at_end == "
           "true only if there is a single successor to block");
    // Insert a begin instruction at the end of the block.
    Instruction* begin_inst = new Instruction(context(), opcode);
    begin_inst->InsertAfter(&*--block->tail());
  } else {
    assert(block->begin()->opcode() != spv::Op::OpPhi &&
           "addInstructionAtBlockBoundary expects to be called with at_end == "
           "false only if there is a single predecessor to block");
    // Insert an end instruction at the beginning of the block.
    Instruction* end_inst = new Instruction(context(), opcode);
    end_inst->InsertBefore(&*block->begin());
  }
}